

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::LLVMDGDumpBlocks::dumpSubgraph
          (LLVMDGDumpBlocks *this,LLVMDependenceGraph *graph,char *name)

{
  _Rb_tree_node_base *p_Var1;
  
  DG2Dot<dg::LLVMNode>::dumpSubgraphStart
            (&this->super_DG2Dot<dg::LLVMNode>,(DependenceGraph<dg::LLVMNode> *)graph,name);
  for (p_Var1 = *(_Rb_tree_node_base **)(graph + 0x78);
      p_Var1 != (_Rb_tree_node_base *)(graph + 0x68);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    dumpBlock(this,(LLVMBBlock *)p_Var1[1]._M_parent);
  }
  for (p_Var1 = *(_Rb_tree_node_base **)(graph + 0x78);
      p_Var1 != (_Rb_tree_node_base *)(graph + 0x68);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    dumpBlockEdges(this,(LLVMBBlock *)p_Var1[1]._M_parent);
  }
  DG2Dot<dg::LLVMNode>::dumpSubgraphEnd
            (&this->super_DG2Dot<dg::LLVMNode>,(DependenceGraph<dg::LLVMNode> *)graph,false);
  return;
}

Assistant:

void dumpSubgraph(LLVMDependenceGraph *graph, const char *name) {
        dumpSubgraphStart(graph, name);

        for (auto &B : graph->getBlocks()) {
            dumpBlock(B.second);
        }

        for (auto &B : graph->getBlocks()) {
            dumpBlockEdges(B.second);
        }

        dumpSubgraphEnd(graph, false);
    }